

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

QByteArray * __thiscall QHttpNetworkReply::readAll(QHttpNetworkReply *this)

{
  QHttpNetworkReplyPrivate *this_00;
  QByteArray *in_RDI;
  QHttpNetworkReplyPrivate *d;
  
  this_00 = d_func((QHttpNetworkReply *)0x304798);
  QByteDataBuffer::readAll((QByteDataBuffer *)this_00);
  return in_RDI;
}

Assistant:

QByteArray QHttpNetworkReply::readAll()
{
    Q_D(QHttpNetworkReply);
    return d->responseData.readAll();
}